

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int fits_quantize_float(long row,float *fdata,long nxpix,long nypix,int nullcheck,
                       float in_null_value,float qlevel,int dither_method,int *idata,double *bscale,
                       double *bzero,int *iminval,int *imaxval)

{
  float fVar1;
  int iVar2;
  long nx_00;
  double *in_RCX;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  double dVar3;
  float in_XMM1_Da;
  float *unaff_retaddr;
  long *in_stack_00000008;
  float in_stack_00000010;
  int in_stack_00000014;
  double *in_stack_00000018;
  int *in_stack_00000020;
  float *in_stack_00000028;
  LONGLONG iqfactor;
  double *in_stack_00000048;
  int nextrand;
  double temp;
  double zeropt;
  double delta;
  float maxval;
  float minval;
  double noise5;
  double noise3;
  double noise2;
  double stdev;
  long ngood;
  long nx;
  long i;
  int iseed;
  int status;
  float local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_ac;
  double local_a0;
  double local_98;
  float local_90;
  float *local_88;
  float *in_stack_ffffffffffffff80;
  float *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  long lVar4;
  float *in_stack_ffffffffffffffa8;
  int local_50;
  int local_14;
  
  local_50 = 0;
  lVar4 = 0;
  local_90 = 0.0;
  local_ac = 0;
  nx_00 = (long)in_RDX * (long)in_RCX;
  if (nx_00 < 2) {
    *(undefined8 *)CONCAT44(in_stack_00000014,in_stack_00000010) = 0x3ff0000000000000;
    *in_stack_00000018 = 0.0;
    local_14 = 0;
  }
  else {
    if (in_XMM1_Da < 0.0) {
      local_98 = (double)-in_XMM1_Da;
      FnNoise3_float(in_stack_ffffffffffffffa8,nx_00,0,
                     (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                     (float)in_stack_ffffffffffffff90,(long *)in_stack_ffffffffffffff88,
                     in_stack_ffffffffffffff80,(float *)CONCAT44(in_R8D,in_XMM0_Da),in_RCX,in_RDX);
    }
    else {
      FnNoise5_float(in_stack_00000028,(long)in_stack_00000020,(long)in_stack_00000018,
                     in_stack_00000014,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                     (float *)iqfactor,in_stack_00000048,(double *)temp,(double *)zeropt,
                     (int *)delta);
      if ((in_R8D == 0) || (lVar4 != 0)) {
        if ((((double)in_stack_ffffffffffffff88 != 0.0) || (NAN((double)in_stack_ffffffffffffff88)))
           && ((double)in_stack_ffffffffffffff88 < (double)in_stack_ffffffffffffff80)) {
          in_stack_ffffffffffffff80 = in_stack_ffffffffffffff88;
        }
        if ((((double)local_88 != 0.0) || (NAN((double)local_88))) &&
           ((double)local_88 < (double)in_stack_ffffffffffffff80)) {
          in_stack_ffffffffffffff80 = local_88;
        }
      }
      else {
        local_90 = 1.0;
        in_stack_ffffffffffffff80 = (float *)0x3ff0000000000000;
      }
      if ((in_XMM1_Da != 0.0) || (NAN(in_XMM1_Da))) {
        local_98 = (double)in_stack_ffffffffffffff80 / (double)in_XMM1_Da;
      }
      else {
        local_98 = (double)in_stack_ffffffffffffff80 / 4.0;
      }
      if ((local_98 == 0.0) && (!NAN(local_98))) {
        return 0;
      }
    }
    if ((double)(local_90 - 0.0) / local_98 <= 4294967284.0) {
      if (0 < in_RDI) {
        if ((fits_rand_value == (float *)0x0) && (iVar2 = fits_init_randoms(), iVar2 != 0)) {
          return 0x71;
        }
        local_50 = (int)((in_RDI + -1) % 10000);
        local_ac = (int)(fits_rand_value[local_50] * 500.0);
      }
      if (lVar4 == nx_00) {
        if (in_R9D == 2) {
          local_a0 = -local_98 * -2147483637.0 + 0.0;
        }
        else if (2147483637.0 <= (double)(local_90 - 0.0) / local_98) {
          local_a0 = (double)(local_90 + 0.0) / 2.0;
        }
        else {
          local_a0 = (double)(long)(0.0 / local_98 + 0.5) * local_98;
        }
        if (in_RDI < 1) {
          for (lVar4 = 0; lVar4 < nx_00; lVar4 = lVar4 + 1) {
            if (((double)*(float *)(in_RSI + lVar4 * 4) - local_a0) / local_98 < 0.0) {
              dVar3 = ((double)*(float *)(in_RSI + lVar4 * 4) - local_a0) / local_98 - 0.5;
            }
            else {
              dVar3 = ((double)*(float *)(in_RSI + lVar4 * 4) - local_a0) / local_98 + 0.5;
            }
            local_c0 = (int)dVar3;
            *(int *)((long)in_stack_00000008 + lVar4 * 4) = local_c0;
          }
        }
        else {
          for (lVar4 = 0; lVar4 < nx_00; lVar4 = lVar4 + 1) {
            if (((in_R9D != 2) || (fVar1 = *(float *)(in_RSI + lVar4 * 4), fVar1 != 0.0)) ||
               (NAN(fVar1))) {
              if ((((double)*(float *)(in_RSI + lVar4 * 4) - local_a0) / local_98 +
                  (double)fits_rand_value[local_ac]) - 0.5 < 0.0) {
                dVar3 = ((((double)*(float *)(in_RSI + lVar4 * 4) - local_a0) / local_98 +
                         (double)fits_rand_value[local_ac]) - 0.5) - 0.5;
              }
              else {
                dVar3 = ((((double)*(float *)(in_RSI + lVar4 * 4) - local_a0) / local_98 +
                         (double)fits_rand_value[local_ac]) - 0.5) + 0.5;
              }
              local_bc = (int)dVar3;
              *(int *)((long)in_stack_00000008 + lVar4 * 4) = local_bc;
            }
            else {
              *(undefined4 *)((long)in_stack_00000008 + lVar4 * 4) = 0x80000002;
            }
            local_ac = local_ac + 1;
            if (local_ac == 10000) {
              local_50 = local_50 + 1;
              if (local_50 == 10000) {
                local_50 = 0;
              }
              local_ac = (int)(fits_rand_value[local_50] * 500.0);
            }
          }
        }
      }
      else {
        local_a0 = -local_98 * -2147483637.0 + 0.0;
        if (in_RDI < 1) {
          for (lVar4 = 0; lVar4 < nx_00; lVar4 = lVar4 + 1) {
            fVar1 = *(float *)(in_RSI + lVar4 * 4);
            if ((fVar1 != in_XMM0_Da) || (NAN(fVar1) || NAN(in_XMM0_Da))) {
              if (((double)*(float *)(in_RSI + lVar4 * 4) - local_a0) / local_98 < 0.0) {
                dVar3 = ((double)*(float *)(in_RSI + lVar4 * 4) - local_a0) / local_98 - 0.5;
              }
              else {
                dVar3 = ((double)*(float *)(in_RSI + lVar4 * 4) - local_a0) / local_98 + 0.5;
              }
              local_c8 = (int)dVar3;
              *(int *)((long)in_stack_00000008 + lVar4 * 4) = local_c8;
            }
            else {
              *(undefined4 *)((long)in_stack_00000008 + lVar4 * 4) = 0x80000001;
            }
          }
        }
        else {
          for (lVar4 = 0; lVar4 < nx_00; lVar4 = lVar4 + 1) {
            fVar1 = *(float *)(in_RSI + lVar4 * 4);
            if ((fVar1 != in_XMM0_Da) || (NAN(fVar1) || NAN(in_XMM0_Da))) {
              if ((in_R9D != 2) ||
                 ((fVar1 = *(float *)(in_RSI + lVar4 * 4), fVar1 != 0.0 || (NAN(fVar1))))) {
                if ((((double)*(float *)(in_RSI + lVar4 * 4) - local_a0) / local_98 +
                    (double)fits_rand_value[local_ac]) - 0.5 < 0.0) {
                  dVar3 = ((((double)*(float *)(in_RSI + lVar4 * 4) - local_a0) / local_98 +
                           (double)fits_rand_value[local_ac]) - 0.5) - 0.5;
                }
                else {
                  dVar3 = ((((double)*(float *)(in_RSI + lVar4 * 4) - local_a0) / local_98 +
                           (double)fits_rand_value[local_ac]) - 0.5) + 0.5;
                }
                local_c4 = (int)dVar3;
                *(int *)((long)in_stack_00000008 + lVar4 * 4) = local_c4;
              }
              else {
                *(undefined4 *)((long)in_stack_00000008 + lVar4 * 4) = 0x80000002;
              }
            }
            else {
              *(undefined4 *)((long)in_stack_00000008 + lVar4 * 4) = 0x80000001;
            }
            local_ac = local_ac + 1;
            if (local_ac == 10000) {
              local_50 = local_50 + 1;
              if (local_50 == 10000) {
                local_50 = 0;
              }
              local_ac = (int)(fits_rand_value[local_50] * 500.0);
            }
          }
        }
      }
      dVar3 = (0.0 - local_a0) / local_98;
      if (dVar3 < 0.0) {
        dVar3 = dVar3 - 0.5;
      }
      else {
        dVar3 = dVar3 + 0.5;
      }
      local_cc = (int)dVar3;
      *in_stack_00000020 = local_cc;
      dVar3 = ((double)local_90 - local_a0) / local_98;
      if (dVar3 < 0.0) {
        dVar3 = dVar3 - 0.5;
      }
      else {
        dVar3 = dVar3 + 0.5;
      }
      local_d0 = (float)(int)dVar3;
      *in_stack_00000028 = local_d0;
      *(double *)CONCAT44(in_stack_00000014,in_stack_00000010) = local_98;
      *in_stack_00000018 = local_a0;
      local_14 = 1;
    }
    else {
      local_14 = 0;
    }
  }
  return local_14;
}

Assistant:

int fits_quantize_float (long row, float fdata[], long nxpix, long nypix, int nullcheck, 
	float in_null_value, float qlevel, int dither_method, int idata[], double *bscale,
	double *bzero, int *iminval, int *imaxval) {

/* arguments:
long row            i: if positive, used to calculate random dithering seed value
                       (this is only used when dithering the quantized values)
float fdata[]       i: array of image pixels to be compressed
long nxpix          i: number of pixels in each row of fdata
long nypix          i: number of rows in fdata
nullcheck           i: check for nullvalues in fdata?
float in_null_value i: value used to represent undefined pixels in fdata
float qlevel        i: quantization level
int dither_method   i; which dithering method to use
int idata[]         o: values of fdata after applying bzero and bscale
double bscale       o: scale factor
double bzero        o: zero offset
int iminval         o: minimum quantized value that is returned
int imaxval         o: maximum quantized value that is returned

The function value will be one if the input fdata were copied to idata;
in this case the parameters bscale and bzero can be used to convert back to
nearly the original floating point values:  fdata ~= idata * bscale + bzero.
If the function value is zero, the data were not copied to idata.
*/

	int status, iseed = 0;
	long i, nx, ngood = 0;
	double stdev, noise2, noise3, noise5;	/* MAD 2nd, 3rd, and 5th order noise values */
	float minval = 0., maxval = 0.;  /* min & max of fdata */
	double delta;		/* bscale, 1 in idata = delta in fdata */
	double zeropt;	        /* bzero */
	double temp;
        int nextrand = 0;
	extern float *fits_rand_value; /* this is defined in imcompress.c */
	LONGLONG iqfactor;

	nx = nxpix * nypix;
	if (nx <= 1) {
	    *bscale = 1.;
	    *bzero  = 0.;
	    return (0);
	}

        if (qlevel >= 0.) {

	    /* estimate background noise using MAD pixel differences */
	    FnNoise5_float(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, &noise2, &noise3, &noise5, &status);      

	    if (nullcheck && ngood == 0) {   /* special case of an image filled with Nulls */
	        /* set parameters to dummy values, which are not used */
		minval = 0.;
		maxval = 1.;
		stdev = 1;
	    } else {

	        /* use the minimum of noise2, noise3, and noise5 as the best noise value */
	        stdev = noise3;
	        if (noise2 != 0. && noise2 < stdev) stdev = noise2;
	        if (noise5 != 0. && noise5 < stdev) stdev = noise5;
            }

	    if (qlevel == 0.)
	        delta = stdev / 4.;  /* default quantization */
	    else
	        delta = stdev / qlevel;

	    if (delta == 0.) 
	        return (0);			/* don't quantize */

	} else {
	    /* negative value represents the absolute quantization level */
	    delta = -qlevel;

	    /* only nned to calculate the min and max values */
	    FnNoise3_float(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, 0, &status);      
 	}

        /* check that the range of quantized levels is not > range of int */
	if ((maxval - minval) / delta > 2. * 2147483647. - N_RESERVED_VALUES )
	    return (0);			/* don't quantize */

        if (row > 0) { /* we need to dither the quantized values */
            if (!fits_rand_value) 
	        if (fits_init_randoms()) return(MEMORY_ALLOCATION);

	    /* initialize the index to the next random number in the list */
            iseed = (int) ((row - 1) % N_RANDOM);
	    nextrand = (int) (fits_rand_value[iseed] * 500.);
	}

        if (ngood == nx) {   /* don't have to check for nulls */
            /* return all positive values, if possible since some */
            /* compression algorithms either only work for positive integers, */
            /* or are more efficient.  */

            if (dither_method == SUBTRACTIVE_DITHER_2)
	    {
                /* shift the range to be close to the value used to represent zeros */
                zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);
            }
	    else if ((maxval - minval) / delta < 2147483647. - N_RESERVED_VALUES )
            {
                zeropt = minval;
		/* fudge the zero point so it is an integer multiple of delta */
		/* This helps to ensure the same scaling will be performed if the */
		/* file undergoes multiple fpack/funpack cycles */
		iqfactor = (LONGLONG) (zeropt/delta  + 0.5);
		zeropt = iqfactor * delta;               
            }
            else
            {
                /* center the quantized levels around zero */
                zeropt = (minval + maxval) / 2.;
            }

            if (row > 0) {  /* dither the values when quantizing */
              for (i = 0;  i < nx;  i++) {
	    
		if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		   idata[i] = ZERO_VALUE;
		} else {
		   idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		}

                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */

       	        for (i = 0;  i < nx;  i++) {
	            idata[i] = NINT ((fdata[i] - zeropt) / delta);
                }
            } 
        }
        else {
            /* data contains null values; shift the range to be */
            /* close to the value used to represent null values */
            zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);

            if (row > 0) {  /* dither the values */
	      for (i = 0;  i < nx;  i++) {
                if (fdata[i] != in_null_value) {
		    if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		       idata[i] = ZERO_VALUE;
		    } else {
		       idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		    }
                } else {
                    idata[i] = NULL_VALUE;
                }

                /* increment the random number index, regardless */
                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */
	       for (i = 0;  i < nx;  i++) {
 
                 if (fdata[i] != in_null_value) {
		    idata[i] =  NINT((fdata[i] - zeropt) / delta);
                 } else { 
                    idata[i] = NULL_VALUE;
                 }
               }
            }
	}

        /* calc min and max values */
        temp = (minval - zeropt) / delta;
        *iminval =  NINT (temp);
        temp = (maxval - zeropt) / delta;
        *imaxval =  NINT (temp);

	*bscale = delta;
	*bzero = zeropt;
	return (1);			/* yes, data have been quantized */
}